

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_valueOptEmpty_Test::~optCompare_valueOptEmpty_Test(optCompare_valueOptEmpty_Test *this)

{
  optCompare_valueOptEmpty_Test *this_local;
  
  ~optCompare_valueOptEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, valueOptEmpty)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i;
  EXPECT_FALSE(1 == i);
  EXPECT_TRUE(1 != i);
  EXPECT_FALSE(1 < i);
  EXPECT_TRUE(1 > i);
  EXPECT_FALSE(1 <= i);
  EXPECT_TRUE(1 >= i);
}